

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O1

void __thiscall
cmArchiveWrite::cmArchiveWrite
          (cmArchiveWrite *this,ostream *os,Compress c,string *format,int compressionLevel,
          int numThreads)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  archive *paVar7;
  uint uVar8;
  ulong uVar9;
  _Alloc_hider _Var10;
  uint uVar11;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_03;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_04;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_05;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_07;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_08;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_09;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_10;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_11;
  string archiveFilterName;
  string compressionLevelStr;
  string source_date_epoch;
  string sNumThreads;
  string local_140;
  string *local_120;
  string local_118;
  string local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  string *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  long *local_a0 [2];
  long local_90 [2];
  string *local_80;
  string *local_78;
  string local_70;
  string local_50;
  
  this->Stream = os;
  paVar7 = archive_write_new();
  this->Archive = paVar7;
  paVar7 = archive_read_disk_new();
  this->Disk = paVar7;
  this->Verbose = false;
  local_80 = &this->Format;
  local_a8 = &(this->Format).field_2;
  (this->Format)._M_dataplus._M_p = (pointer)local_a8;
  pcVar3 = (format->_M_dataplus)._M_p;
  local_78 = format;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar3,pcVar3 + format->_M_string_length);
  local_b0 = &(this->Error).field_2;
  (this->Error)._M_dataplus._M_p = (pointer)local_b0;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->MTime).field_2;
  (this->MTime)._M_dataplus._M_p = (pointer)local_b8;
  (this->MTime)._M_string_length = 0;
  (this->MTime).field_2._M_local_buf[0] = '\0';
  (this->Uid).IsValueSet = false;
  (this->Gid).IsValueSet = false;
  local_c0 = &(this->Uname).field_2;
  (this->Uname)._M_dataplus._M_p = (pointer)local_c0;
  (this->Uname)._M_string_length = 0;
  (this->Uname).field_2._M_local_buf[0] = '\0';
  local_c8 = &(this->Gname).field_2;
  (this->Gname)._M_dataplus._M_p = (pointer)local_c8;
  (this->Gname)._M_string_length = 0;
  (this->Gname).field_2._M_local_buf[0] = '\0';
  (this->Permissions).IsValueSet = false;
  (this->PermissionsMask).IsValueSet = false;
  if (numThreads < 1) {
    uVar5 = -numThreads;
    if (0 < numThreads) {
      uVar5 = numThreads;
    }
    uVar11 = 0x7fffffff;
    if (numThreads != 0) {
      uVar11 = uVar5;
    }
    uVar5 = std::thread::hardware_concurrency();
    if ((int)uVar5 <= (int)uVar11) {
      uVar11 = uVar5;
    }
    numThreads = 1;
    if (0 < (int)uVar5) {
      numThreads = uVar11;
    }
  }
  uVar5 = -numThreads;
  if (0 < numThreads) {
    uVar5 = numThreads;
  }
  uVar11 = 1;
  if (9 < uVar5) {
    uVar9 = (ulong)uVar5;
    uVar4 = 4;
    do {
      uVar11 = uVar4;
      uVar8 = (uint)uVar9;
      if (uVar8 < 100) {
        uVar11 = uVar11 - 2;
        goto LAB_003c5ab8;
      }
      if (uVar8 < 1000) {
        uVar11 = uVar11 - 1;
        goto LAB_003c5ab8;
      }
      if (uVar8 < 10000) goto LAB_003c5ab8;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar11 + 4;
    } while (99999 < uVar8);
    uVar11 = uVar11 + 1;
  }
LAB_003c5ab8:
  local_120 = (string *)&this->Error;
  local_a0[0] = local_90;
  std::__cxx11::string::_M_construct((ulong)local_a0,(char)uVar11 - (char)(numThreads >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_a0[0] + (ulong)((uint)numThreads >> 0x1f)),uVar11,uVar5);
  switch(c) {
  case CompressNone:
    iVar6 = archive_write_add_filter_none(this->Archive);
    if (iVar6 == 0) goto switchD_003c5b14_default;
    cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
    local_f8._M_dataplus._M_p = (pointer)0x1f;
    local_f8._M_string_length = 0x8191f0;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = local_140._M_string_length;
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_140._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = (iterator)&local_f8;
    local_d0 = &local_140;
    cmCatViews(&local_118,views);
    break;
  case CompressCompress:
    iVar6 = archive_write_add_filter_compress(this->Archive);
    if (iVar6 == 0) goto switchD_003c5b14_default;
    cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
    local_f8._M_dataplus._M_p = (pointer)0x23;
    local_f8._M_string_length = 0x819210;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = local_140._M_string_length;
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_140._M_dataplus._M_p;
    views_03._M_len = 2;
    views_03._M_array = (iterator)&local_f8;
    local_d0 = &local_140;
    cmCatViews(&local_118,views_03);
    break;
  case CompressGZip:
    iVar6 = archive_write_add_filter_gzip(this->Archive);
    if (iVar6 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
      local_f8._M_dataplus._M_p = (pointer)0x1f;
      local_f8._M_string_length = 0x819234;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = local_140._M_string_length;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_140._M_dataplus._M_p;
      views_01._M_len = 2;
      views_01._M_array = (iterator)&local_f8;
      local_d0 = &local_140;
      cmCatViews(&local_118,views_01);
      break;
    }
    paVar1 = &local_f8.field_2;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity =
         local_f8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&local_f8);
    if (((char *)local_f8._M_string_length == (char *)0x0) ||
       (iVar6 = archive_write_set_filter_option(this->Archive,"gzip","timestamp",(char *)0x0),
       iVar6 == 0)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      goto switchD_003c5b14_default;
    }
    cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
    cmStrCat<char_const(&)[34],std::__cxx11::string>
              (&local_118,(char (*) [34])"archive_write_set_filter_option: ",&local_140);
    std::__cxx11::string::operator=(local_120,(string *)&local_118);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
    local_118.field_2._M_allocated_capacity = local_f8.field_2._M_allocated_capacity;
    _Var10._M_p = local_f8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p == paVar1) goto LAB_003c6397;
    goto LAB_003c638f;
  case CompressBZip2:
    iVar6 = archive_write_add_filter_bzip2(this->Archive);
    if (iVar6 == 0) goto switchD_003c5b14_default;
    cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
    local_f8._M_dataplus._M_p = (pointer)0x20;
    local_f8._M_string_length = 0x819280;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = local_140._M_string_length;
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_140._M_dataplus._M_p;
    views_02._M_len = 2;
    views_02._M_array = (iterator)&local_f8;
    local_d0 = &local_140;
    cmCatViews(&local_118,views_02);
    break;
  case CompressLZMA:
    iVar6 = archive_write_add_filter_lzma(this->Archive);
    if (iVar6 == 0) goto switchD_003c5b14_default;
    cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
    local_f8._M_dataplus._M_p = (pointer)0x1f;
    local_f8._M_string_length = 0x8192a1;
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = local_140._M_string_length;
    local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_140._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = (iterator)&local_f8;
    local_d0 = &local_140;
    cmCatViews(&local_118,views_00);
    break;
  case CompressXZ:
    iVar6 = archive_write_add_filter_xz(this->Archive);
    if (iVar6 == 0) {
      iVar6 = archive_write_set_filter_option(this->Archive,"xz","threads",(char *)local_a0[0]);
      if (iVar6 == 0) goto switchD_003c5b14_default;
      cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
      local_f8._M_dataplus._M_p = (pointer)0x1f;
      local_f8._M_string_length = 0x8192e7;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = local_140._M_string_length;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_140._M_dataplus._M_p;
      views_06._M_len = 2;
      views_06._M_array = (iterator)&local_f8;
      local_d0 = &local_140;
      cmCatViews(&local_118,views_06);
    }
    else {
      cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
      local_f8._M_dataplus._M_p = (pointer)0x1d;
      local_f8._M_string_length = 0x8192c1;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = local_140._M_string_length;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_140._M_dataplus._M_p;
      views_04._M_len = 2;
      views_04._M_array = (iterator)&local_f8;
      local_d0 = &local_140;
      cmCatViews(&local_118,views_04);
    }
    break;
  case CompressZstd:
    iVar6 = archive_write_add_filter_zstd(this->Archive);
    if (iVar6 == 0) {
      iVar6 = archive_write_set_filter_option(this->Archive,"zstd","threads",(char *)local_a0[0]);
      if (iVar6 == 0) goto switchD_003c5b14_default;
      cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
      local_f8._M_dataplus._M_p = (pointer)0x21;
      local_f8._M_string_length = 0x819327;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = local_140._M_string_length;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_140._M_dataplus._M_p;
      views_07._M_len = 2;
      views_07._M_array = (iterator)&local_f8;
      local_d0 = &local_140;
      cmCatViews(&local_118,views_07);
    }
    else {
      cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
      local_f8._M_dataplus._M_p = (pointer)0x1f;
      local_f8._M_string_length = 0x819307;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = local_140._M_string_length;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_140._M_dataplus._M_p;
      views_05._M_len = 2;
      views_05._M_array = (iterator)&local_f8;
      local_d0 = &local_140;
      cmCatViews(&local_118,views_05);
    }
    break;
  default:
switchD_003c5b14_default:
    if (compressionLevel != 0) {
      uVar5 = -compressionLevel;
      if (0 < compressionLevel) {
        uVar5 = compressionLevel;
      }
      uVar11 = 1;
      if (9 < uVar5) {
        uVar9 = (ulong)uVar5;
        uVar4 = 4;
        do {
          uVar11 = uVar4;
          uVar8 = (uint)uVar9;
          if (uVar8 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_003c6054;
          }
          if (uVar8 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_003c6054;
          }
          if (uVar8 < 10000) goto LAB_003c6054;
          uVar9 = uVar9 / 10000;
          uVar4 = uVar11 + 4;
        } while (99999 < uVar8);
        uVar11 = uVar11 + 1;
      }
LAB_003c6054:
      paVar1 = &local_118.field_2;
      local_118._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct
                ((ulong)&local_118,(char)uVar11 - (char)(compressionLevel >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_118._M_dataplus._M_p + ((uint)compressionLevel >> 0x1f),uVar11,uVar5);
      paVar2 = &local_140.field_2;
      local_140._M_string_length = 0;
      local_140.field_2._M_local_buf[0] = '\0';
      local_140._M_dataplus._M_p = (pointer)paVar2;
      if (c - CompressGZip < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_140,0,(char *)0x0,
                   (ulong)(&DAT_008191b4 + *(int *)(&DAT_008191b4 + (ulong)(c - CompressGZip) * 4)))
        ;
      }
      if ((local_140._M_string_length != 0) &&
         (iVar6 = archive_write_set_filter_option
                            (this->Archive,local_140._M_dataplus._M_p,"compression-level",
                             local_118._M_dataplus._M_p), iVar6 != 0)) {
        cm_archive_error_string_abi_cxx11_(&local_70,this->Archive);
        local_f8._M_dataplus._M_p = (pointer)0x21;
        local_f8._M_string_length = 0x81925e;
        local_f8.field_2._M_allocated_capacity = 0;
        local_f8.field_2._8_8_ = local_70._M_string_length;
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_70._M_dataplus._M_p;
        views_08._M_len = 2;
        views_08._M_array = (iterator)&local_f8;
        local_d0 = &local_70;
        cmCatViews(&local_50,views_08);
        std::__cxx11::string::operator=(local_120,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != paVar2) {
          operator_delete(local_140._M_dataplus._M_p,
                          CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                   local_140.field_2._M_local_buf[0]) + 1);
        }
        _Var10._M_p = local_118._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p == paVar1) goto LAB_003c6397;
        goto LAB_003c638f;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != paVar2) {
        operator_delete(local_140._M_dataplus._M_p,
                        CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                                 local_140.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar1) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
    }
    iVar6 = archive_read_disk_set_standard_lookup(this->Disk);
    if (iVar6 == 0) {
      iVar6 = archive_write_set_format_by_name(this->Archive,(local_78->_M_dataplus)._M_p);
      if (iVar6 == 0) {
        iVar6 = archive_write_set_bytes_in_last_block(this->Archive,1);
        if (iVar6 == 0) goto LAB_003c6397;
        cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
        local_f8._M_dataplus._M_p = (pointer)0x27;
        local_f8._M_string_length = 0x8193a6;
        local_f8.field_2._M_allocated_capacity = 0;
        local_f8.field_2._8_8_ = local_140._M_string_length;
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_140._M_dataplus._M_p;
        views_11._M_len = 2;
        views_11._M_array = (iterator)&local_f8;
        local_d0 = &local_140;
        cmCatViews(&local_118,views_11);
      }
      else {
        cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
        local_f8._M_dataplus._M_p = (pointer)0x22;
        local_f8._M_string_length = 0x819383;
        local_f8.field_2._M_allocated_capacity = 0;
        local_f8.field_2._8_8_ = local_140._M_string_length;
        local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_140._M_dataplus._M_p;
        views_10._M_len = 2;
        views_10._M_array = (iterator)&local_f8;
        local_d0 = &local_140;
        cmCatViews(&local_118,views_10);
      }
    }
    else {
      cm_archive_error_string_abi_cxx11_(&local_140,this->Archive);
      local_f8._M_dataplus._M_p = (pointer)0x27;
      local_f8._M_string_length = 0x81935b;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = local_140._M_string_length;
      local_d8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_140._M_dataplus._M_p;
      views_09._M_len = 2;
      views_09._M_array = (iterator)&local_f8;
      local_d0 = &local_140;
      cmCatViews(&local_118,views_09);
    }
  }
  std::__cxx11::string::operator=(local_120,(string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    local_118.field_2._M_allocated_capacity =
         CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,local_140.field_2._M_local_buf[0]);
    _Var10._M_p = local_140._M_dataplus._M_p;
LAB_003c638f:
    operator_delete(_Var10._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
LAB_003c6397:
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0],local_90[0] + 1);
  }
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(std::ostream& os, Compress c,
                               std::string const& format, int compressionLevel,
                               int numThreads)
  : Stream(os)
  , Archive(archive_write_new())
  , Disk(archive_read_disk_new())
  , Format(format)
{
  // Upstream fixed an issue with their integer parsing in 3.4.0
  // which would cause spurious errors to be raised from `strtoull`.

  if (numThreads < 1) {
    int upperLimit = (numThreads == 0) ? std::numeric_limits<int>::max()
                                       : std::abs(numThreads);

    numThreads =
      cm::clamp<int>(std::thread::hardware_concurrency(), 1, upperLimit);
  }

  std::string sNumThreads = std::to_string(numThreads);

  switch (c) {
    case CompressNone:
      if (archive_write_add_filter_none(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_none: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressCompress:
      if (archive_write_add_filter_compress(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_compress: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressGZip: {
      if (archive_write_add_filter_gzip(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_gzip: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      std::string source_date_epoch;
      cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
      if (!source_date_epoch.empty()) {
        // We're not able to specify an arbitrary timestamp for gzip.
        // The next best thing is to omit the timestamp entirely.
        if (archive_write_set_filter_option(this->Archive, "gzip", "timestamp",
                                            nullptr) != ARCHIVE_OK) {
          this->Error = cmStrCat("archive_write_set_filter_option: ",
                                 cm_archive_error_string(this->Archive));
          return;
        }
      }
    } break;
    case CompressBZip2:
      if (archive_write_add_filter_bzip2(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_bzip2: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressLZMA:
      if (archive_write_add_filter_lzma(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_lzma: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressXZ:
      if (archive_write_add_filter_xz(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_xz: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3004000

#  ifdef _AIX
      // FIXME: Using more than 2 threads creates an empty archive.
      // Enforce this limit pending further investigation.
      if (numThreads > 2) {
        numThreads = 2;
        sNumThreads = std::to_string(numThreads);
      }
#  endif
      if (archive_write_set_filter_option(this->Archive, "xz", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_xz_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif

      break;
    case CompressZstd:
      if (archive_write_add_filter_zstd(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_zstd: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3006000
      if (archive_write_set_filter_option(this->Archive, "zstd", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_zstd_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif
      break;
  }

  if (compressionLevel != 0) {
    std::string compressionLevelStr = std::to_string(compressionLevel);
    std::string archiveFilterName;
    switch (c) {
      case CompressNone:
      case CompressCompress:
        break;
      case CompressGZip:
        archiveFilterName = "gzip";
        break;
      case CompressBZip2:
        archiveFilterName = "bzip2";
        break;
      case CompressLZMA:
        archiveFilterName = "lzma";
        break;
      case CompressXZ:
        archiveFilterName = "xz";
        break;
      case CompressZstd:
        archiveFilterName = "zstd";
        break;
    }
    if (!archiveFilterName.empty()) {
      if (archive_write_set_filter_option(
            this->Archive, archiveFilterName.c_str(), "compression-level",
            compressionLevelStr.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_set_filter_option: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
    }
  }

#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_read_disk_set_standard_lookup: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
#endif

  if (archive_write_set_format_by_name(this->Archive, format.c_str()) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_set_format_by_name: ",
                           cm_archive_error_string(this->Archive));
    return;
  }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1)) {
    this->Error = cmStrCat("archive_write_set_bytes_in_last_block: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
}